

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

bool tinyobj::parseOnOff(char **token,bool default_value)

{
  char *__s;
  char *__s_00;
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  
  __s_00 = *token;
  sVar1 = strspn(__s_00," \t");
  __s = __s_00 + sVar1;
  *token = __s;
  sVar2 = strcspn(__s," \t\r");
  bVar3 = true;
  if (((__s_00[sVar1] == 'o') && (__s[1] != 'n')) && (__s[1] == 'f')) {
    bVar3 = __s[2] != 'f';
  }
  *token = __s + sVar2;
  return bVar3;
}

Assistant:

static inline bool parseOnOff(const char **token, bool default_value = true) {
  (*token) += strspn((*token), " \t");
  const char *end = (*token) + strcspn((*token), " \t\r");

  bool ret = default_value;
  if ((0 == strncmp((*token), "on", 2))) {
    ret = true;
  } else if ((0 == strncmp((*token), "off", 3))) {
    ret = false;
  }

  (*token) = end;
  return ret;
}